

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCArray NULLC::ShortToStr(short *r)

{
  char **ppcVar1;
  int iVar2;
  NULLCArray NVar3;
  char *local_68;
  char *str;
  uint local_58;
  char **local_40;
  char *curr;
  char buf [16];
  bool sign;
  short number;
  short *r_local;
  NULLCArray arr;
  
  memset((void *)((long)&r_local + 4),0,0xc);
  if (r == (short *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    buf._14_2_ = *r;
    buf[0xd] = (short)buf._14_2_ < 0;
    iVar2 = (int)(short)buf._14_2_ % 10;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    curr._0_1_ = (char)iVar2 + '0';
    ppcVar1 = &curr;
    while( true ) {
      local_40 = (char **)((long)ppcVar1 + 1);
      buf._14_2_ = (short)buf._14_2_ / 10;
      if (buf._14_2_ == 0) break;
      iVar2 = (int)(short)buf._14_2_ % 10;
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      *(char *)local_40 = (char)iVar2 + '0';
      ppcVar1 = local_40;
    }
    if ((buf[0xd] & 1U) != 0) {
      *(char *)local_40 = '-';
      local_40 = (char **)((long)ppcVar1 + 2);
    }
    NVar3 = AllocArray(1,((int)local_40 - (int)&curr) + 1,2);
    str = NVar3.ptr;
    local_58 = NVar3.len;
    stack0xffffffffffffffec = str;
    arr.ptr._0_4_ = local_58;
    local_68 = str;
    do {
      local_40 = (char **)((long)local_40 + -1);
      *local_68 = *(char *)local_40;
      local_68 = local_68 + 1;
    } while (local_40 != &curr);
  }
  NVar3.len = (uint)arr.ptr;
  NVar3.ptr = stack0xffffffffffffffec;
  return NVar3;
}

Assistant:

NULLCArray NULLC::ShortToStr(short* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	short number = *r;
	bool sign = 0;
	char buf[16];
	char *curr = buf;
	if(number < 0)
		sign = 1;

	*curr++ = (char)(abs(number % 10) + '0');
	while(number /= 10)
		*curr++ = (char)(abs(number % 10) + '0');
	if(sign)
		*curr++ = '-';
	arr = AllocArray(1, (int)(curr - buf) + 1, NULLC_TYPE_CHAR);
	char *str = arr.ptr;
	do 
	{
		--curr;
		*str++ = *curr;
	}while(curr != buf);
	return arr;
}